

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsgdot(prscxdef *ctx,prsndef *n,int cnt)

{
  ushort uVar1;
  tokcxdef *ptVar2;
  toktdef *ptVar3;
  mcmcxdef *pmVar4;
  long lVar5;
  char *facility;
  undefined4 in_EDX;
  prscxdef *in_RSI;
  long in_RDI;
  prpnum prop;
  tokdef *sc_tok;
  objnum exp_inh_obj;
  uchar ptr_op;
  uchar reg_op;
  int exp_inh;
  int objflg;
  int slf;
  int inh;
  prsndef *n1;
  prsndef *n0;
  undefined8 in_stack_ffffffffffffffa8;
  ushort bytes;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  ushort uVar6;
  undefined2 in_stack_ffffffffffffffc4;
  int typ;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 uVar12;
  
  bytes = (ushort)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  ptVar2 = in_RSI->prscxtok;
  ptVar3 = in_RSI->prscxstab;
  iVar9 = 0;
  iVar10 = 0;
  iVar8 = 0;
  iVar11 = 0;
  uVar7 = CONCAT13(0x12,CONCAT12(0x28,in_stack_ffffffffffffffc4));
  if ((*(int *)((long)&ptVar2->tokcxerr + 4) == 0) && (*(int *)&ptVar2->tokcxmem == 0x38)) {
    facility = (char *)(ulong)(*(byte *)&ptVar2->tokcxsend - 2);
    switch(facility) {
    case (char *)0x0:
    case (char *)0x5:
      iVar9 = 1;
      uVar7 = CONCAT13(0x3e,CONCAT12(0x28,in_stack_ffffffffffffffc4));
      break;
    case (char *)0x3:
      if ((*(ushort *)(in_RDI + 0x80) & 0x40) != 0) {
        errlogf((errcxdef *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),facility,0
               );
      }
      iVar10 = 1;
      uVar7 = CONCAT13(0x3c,CONCAT12(0x52,(short)uVar7));
      break;
    case (char *)0x7:
      iVar11 = 1;
      uVar7 = CONCAT13(0x47,CONCAT12(0x27,in_stack_ffffffffffffffc4));
    }
    bytes = (ushort)((ulong)facility >> 0x30);
  }
  else if ((*(int *)((long)&ptVar2->tokcxerr + 4) == 1) && (*(int *)&ptVar2->tokcxerr == 0x20)) {
    iVar11 = 1;
    iVar8 = 1;
    typ = CONCAT13(0x2e,CONCAT12(0x2f,in_stack_ffffffffffffffc4));
    pmVar4 = ptVar2->tokcxmem;
    prsdef((prscxdef *)0x100000000,(tokdef *)0x1,typ);
    uVar7 = CONCAT22((short)((uint)typ >> 0x10),*(undefined2 *)((long)&pmVar4[1].mcmcxldf + 2));
  }
  if (((iVar11 == 0) && (iVar10 == 0)) && (iVar9 == 0)) {
    prsgexp(in_RSI,(prsndef *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  if ((*(int *)((long)&ptVar3->toktfadd + 4) == 0) && (*(int *)&ptVar3->toktfsea == 0x55)) {
    uVar6 = *(ushort *)&ptVar3->toktfeach;
    emtres((emtcxdef *)CONCAT26(uVar6,in_stack_ffffffffffffffb0),bytes);
    uVar12 = (undefined1)in_EDX;
    lVar5 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
    *(char *)(lVar5 + (int)(uint)uVar1) = (char)(uVar7 >> 0x18);
    emtres((emtcxdef *)CONCAT26(uVar6,in_stack_ffffffffffffffb0),bytes);
    lVar5 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
    *(undefined1 *)(lVar5 + (int)(uint)uVar1) = uVar12;
    if (iVar9 != 0) {
      emtres((emtcxdef *)CONCAT26(uVar6,in_stack_ffffffffffffffb0),bytes);
      oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                    (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),
            (uint)*(ushort *)((long)&ptVar2->tokcxsend + 2));
      *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
    }
    emtres((emtcxdef *)CONCAT26(uVar6,in_stack_ffffffffffffffb0),bytes);
    oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                  (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),(uint)uVar6);
    *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
    if (iVar8 != 0) {
      emtres((emtcxdef *)CONCAT26(uVar6,in_stack_ffffffffffffffb0),bytes);
      oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                    (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),uVar7 & 0xffff);
      *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
    }
  }
  else {
    if (iVar9 != 0) {
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    }
    prsgexp(in_RSI,(prsndef *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    uVar12 = (undefined1)in_EDX;
    emtres((emtcxdef *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),bytes);
    lVar5 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
    uVar6 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar6 + 1;
    *(char *)(lVar5 + (int)(uint)uVar6) = (char)(uVar7 >> 0x10);
    emtres((emtcxdef *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),bytes);
    lVar5 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
    uVar6 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar6 + 1;
    *(undefined1 *)(lVar5 + (int)(uint)uVar6) = uVar12;
    if (iVar8 != 0) {
      emtres((emtcxdef *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),bytes);
      oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                    (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),uVar7 & 0xffff);
      *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
    }
  }
  return;
}

Assistant:

static void prsgdot(prscxdef *ctx, prsndef *n, int cnt)
{
    prsndef *n0 = n->prsnv.prsnvn[0];
    prsndef *n1 = n->prsnv.prsnvn[1];
    int      inh;                                 /* flag: "inherited.prop" */
    int      slf;                                      /* flag: "self.prop" */
    int      objflg;           /* flag: LHS of dot is constant object value */
    int      exp_inh;                  /* flag: "inherited superclass.prop" */
    uchar    reg_op;                /* operator to use for regular property */
    uchar    ptr_op;                /* operator to use for property pointer */
    objnum   exp_inh_obj;     /* explicit superclass object to inherit from */

    /* presume we'll have a regular object expression for the LHS */
    inh = exp_inh = slf = objflg = FALSE;

    /* set up the default opcodes for ordinary object expressions */
    reg_op = OPCGETP;
    ptr_op = OPCPTRGETP;

    /* check for special left-hand-side values */
    if (n0->prsnnlf == 0 && n0->prsnv.prsnvt.toktyp == TOKTSYMBOL)
    {
        switch(n0->prsnv.prsnvt.toksym.tokstyp)
        {
        case TOKSTINHERIT:
            inh = TRUE;
            reg_op = OPCINHERIT;
            ptr_op = OPCPTRINH;
            break;
            
        case TOKSTSELF:
            if (ctx->prscxflg & PRSCXFFUNC) errlog(ctx->prscxerr, ERR_NOSELF);
            slf = TRUE;
            reg_op = OPCGETPSELF;
            ptr_op = OPCGETPPTRSELF;
            break;
            
        case TOKSTOBJ:
        case TOKSTFWDOBJ:
            objflg = TRUE;
            reg_op = OPCGETPOBJ;
            break;
        }
    }
    else if (n0->prsnnlf == 1 && n0->prsntyp == TOKTEXPINH)
    {
        tokdef *sc_tok;
        
        /* 
         *   explicit superclass inheritance - this is inheritance, but
         *   with an explicit superclass value 
         */
        inh = TRUE;
        exp_inh = TRUE;
        reg_op = OPCEXPINH;
        ptr_op = OPCEXPINHPTR;

        /* get the explicit superclass subnode */
        sc_tok = &n0->prsnv.prsnvn[0]->prsnv.prsnvt;

        /* make sure the superclass is an object */
        prsdef(ctx, sc_tok, TOKSTFWDOBJ);

        /* get the explicit superclass - it's the subnode */
        exp_inh_obj = sc_tok->toksym.toksval;
    }

    /* 
     *   push object whose property we're getting unless inheriting or
     *   getting a property of 'self' or of a fixed object (in which cases
     *   the object is implicit in the opcode, rather than being on the
     *   stack) 
     */
    if (!inh && !slf && !objflg)
        prsgexp(ctx, n0);

    if (n1->prsnnlf == 0
        && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
    {
        /* RHS is a property symbol - do a simple GETP (or INHERIT) */
        prpnum prop = n1->prsnv.prsnvt.tokofs;

        /* 
         *   emit the opcode and argument count - use the regular
         *   (non-pointer) opcode, since we have a regular property value 
         */
        emtop(ctx->prscxemt, reg_op);
        emtbyte(ctx->prscxemt, cnt);

        /* if we are encoding the object in the instruction, emit it now */
        if (objflg)
            emtint2(ctx->prscxemt, n0->prsnv.prsnvt.toksym.toksval);

        /* add the property value */
        emtint2(ctx->prscxemt, prop);

        /* 
         *   if this is an "inherited" with an explicit superclass, add
         *   the explicit superclass value 
         */
        if (exp_inh)
            emtint2(ctx->prscxemt, exp_inh_obj);
    }
    else
    {
        /* 
         *   evaluate the LHS unconditionally, even if it's just a fixed
         *   object, since we have no special instruction that encodes an
         *   object value in a pointer property evaluation 
         */
        if (objflg)
            prsgexp(ctx, n0);

        /* RHS is an expression - evaluate it */
        prsgexp(ctx, n1);

        /* 
         *   emit the opcode and the byte count - use the pointer opcode,
         *   since we have a property pointer 
         */
        emtop(ctx->prscxemt, ptr_op);
        emtbyte(ctx->prscxemt, cnt);

        /* 
         *   if this is an "inherited" with an explicit superclass, add
         *   the explicit superclass value 
         */
        if (exp_inh)
            emtint2(ctx->prscxemt, exp_inh_obj);
    }
}